

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex7.cpp
# Opt level: O0

char * cat_dot(char *s1,char *s2,char *delim)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  char *pcVar4;
  bool bVar5;
  uint32_t cnt;
  char *begin;
  char *str;
  char *pcStack_20;
  uint32_t size;
  char *delim_local;
  char *s2_local;
  char *s1_local;
  
  uVar1 = str_len(s1);
  uVar2 = str_len(s2);
  uVar3 = str_len(delim);
  pcVar4 = (char *)operator_new__((ulong)(uVar1 + uVar2 + uVar3 + 1));
  begin = pcVar4;
  s2_local = s1;
  while( true ) {
    bVar5 = false;
    if (s2_local != (char *)0x0) {
      bVar5 = *s2_local != '\0';
    }
    pcStack_20 = delim;
    if (!bVar5) break;
    *begin = *s2_local;
    begin = begin + 1;
    s2_local = s2_local + 1;
  }
  while( true ) {
    bVar5 = false;
    if (pcStack_20 != (char *)0x0) {
      bVar5 = *pcStack_20 != '\0';
    }
    delim_local = s2;
    if (!bVar5) break;
    *begin = *pcStack_20;
    begin = begin + 1;
    pcStack_20 = pcStack_20 + 1;
  }
  while( true ) {
    bVar5 = false;
    if (delim_local != (char *)0x0) {
      bVar5 = *delim_local != '\0';
    }
    if (!bVar5) break;
    *begin = *delim_local;
    begin = begin + 1;
    delim_local = delim_local + 1;
  }
  *begin = '\0';
  return pcVar4;
}

Assistant:

char* cat_dot(const char* s1, const char* s2, const char* delim)
{
	uint32_t size = str_len(s1) + str_len(s2) + str_len(delim) + 1;
	char* str = new char[size];
	char* begin = str;
	uint32_t cnt = 0;
	while (s1 && *s1)
	{
		*str++ = *s1++;
	}

	while (delim && *delim)
	{
		*str++ = *delim++;
	}

	while (s2 && *s2)
	{
		*str++ = *s2++;
	}
	*str = '\0';
	return begin;
}